

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::ReconstructPrim<tinyusdz::GeomSubset>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,GeomSubset *subset
               ,string *warn,string *err,PrimReconstructOptions *options)

{
  anon_struct_8_0_00000001_for___align *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_struct_8_0_00000001_for___align *paVar3;
  uint uVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  size_type sVar7;
  ulong uVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  bool *pbVar12;
  ostream *poVar13;
  undefined8 *puVar14;
  long *plVar15;
  const_iterator cVar16;
  mapped_type *pmVar17;
  _Base_ptr p_Var18;
  Collection *coll;
  size_type __n;
  Property *args_1;
  string sVar19;
  _Rb_tree_header *p_Var20;
  bool bVar21;
  bool bVar22;
  ParseResult ret;
  string attr_type_name;
  Attribute *attr;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  optional<tinyusdz::Token> pv;
  TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_fffffffffffffc88;
  undefined1 local_370 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_358;
  undefined1 local_348 [8];
  char *local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  string local_320;
  TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *local_300;
  string *local_2f8;
  Attribute *local_2f0;
  Property *local_2e8;
  bool *local_2e0;
  string local_2d8;
  anon_struct_8_0_00000001_for___align local_2b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b0;
  undefined4 *local_280;
  undefined8 local_278;
  undefined4 local_270;
  undefined1 uStack_26c;
  undefined1 uStack_26b;
  undefined2 uStack_26a;
  optional<tinyusdz::Token> *local_260;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_258;
  AttrMetas *local_250;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *local_248;
  bool *local_240;
  string *local_238;
  _Base_ptr local_230;
  long *local_228;
  ulong local_220;
  long local_218 [2];
  long *local_208 [2];
  long local_1f8 [2];
  undefined1 local_1e8 [16];
  code *local_1d8;
  code *apcStack_1d0 [11];
  ios_base local_178 [16];
  ios_base local_168 [272];
  storage_t<tinyusdz::Token> local_58;
  
  local_2b0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2b0._M_impl.super__Rb_tree_header._M_header;
  local_2b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bVar21 = false;
  local_2b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2b0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2f8 = warn;
  local_2b0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2b0._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar9 = anon_unknown_0::ReconstructMaterialBindingProperties
                    ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_2b0,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,&subset->super_MaterialBinding,err);
  if (bVar9) {
    coll = &subset->super_Collection;
    if (subset == (GeomSubset *)0x0) {
      coll = (Collection *)0x0;
    }
    args_1 = (Property *)err;
    bVar9 = anon_unknown_0::ReconstructCollectionProperties
                      ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_2b0,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                        *)properties,coll,local_2f8,err,options->strict_allowedToken_check);
    if (bVar9) {
      p_Var18 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var20 = &(properties->_M_t)._M_impl.super__Rb_tree_header;
      bVar21 = (_Rb_tree_header *)p_Var18 == p_Var20;
      if (!bVar21) {
        local_250 = &(subset->familyName)._metas;
        local_248 = &(subset->familyName)._paths;
        local_260 = &(subset->familyName)._attrib;
        local_2e0 = &(subset->familyName)._blocked;
        local_240 = &(subset->familyName)._value_empty;
        local_238 = (string *)&subset->indices;
        local_258 = &subset->props;
        local_2e8 = (Property *)&subset->elementType;
        local_300 = (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                     *)err;
        local_230 = &p_Var20->_M_header;
        do {
          local_228 = local_218;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_228,*(long *)(p_Var18 + 1),
                     (long)&(p_Var18[1]._M_parent)->_M_color + *(long *)(p_Var18 + 1));
          local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"familyName","");
          uVar8 = local_220;
          sVar7 = local_2d8._M_string_length;
          local_340 = local_338._M_local_buf + 8;
          local_338._M_allocated_capacity = 0;
          local_338._8_8_ = local_338._8_8_ & 0xffffffffffffff00;
          __n = local_220;
          if (local_2d8._M_string_length < local_220) {
            __n = local_2d8._M_string_length;
          }
          if (__n == 0) {
            bVar9 = true;
          }
          else {
            iVar10 = bcmp(local_228,local_2d8._M_dataplus._M_p,__n);
            bVar9 = iVar10 == 0;
          }
          local_2f0 = (Attribute *)(p_Var18 + 2);
          if ((bool)(bVar9 ^ 1U | uVar8 != sVar7)) {
            local_348._0_4_ = 1;
          }
          else {
            Attribute::type_name_abi_cxx11_(&local_320,local_2f0);
            local_1e8._0_8_ = &local_1d8;
            local_1e8._8_8_ = (anon_struct_8_0_00000001_for___align)0x5;
            local_1d8 = (code *)CONCAT26(local_1d8._6_2_,0x6e656b6f74);
            if (local_320._M_string_length == 5) {
              bVar9 = (char)*(int *)(local_320._M_dataplus._M_p + 4) == 'n' &&
                      *(int *)local_320._M_dataplus._M_p == 0x656b6f74;
            }
            else {
              bVar9 = false;
            }
            bVar22 = true;
            if (!bVar9) {
              local_280 = &local_270;
              uStack_26c = 0x6e;
              local_270 = 0x656b6f74;
              local_278 = 5;
              uStack_26b = 0;
              if (local_320._M_string_length == 5) {
                bVar22 = (char)*(int *)(local_320._M_dataplus._M_p + 4) == 'n' &&
                         *(int *)local_320._M_dataplus._M_p == 0x656b6f74;
              }
              else {
                bVar22 = false;
              }
            }
            if ((!bVar9) && (local_280 != &local_270)) {
              operator_delete(local_280,
                              CONCAT26(uStack_26a,
                                       CONCAT15(uStack_26b,CONCAT14(uStack_26c,local_270))) + 1);
            }
            if ((code **)local_1e8._0_8_ != &local_1d8) {
              operator_delete((void *)local_1e8._0_8_,(long)local_1d8 + 1);
            }
            if (!bVar22) {
              local_348._0_4_ = 3;
              ::std::__cxx11::stringstream::stringstream((stringstream *)local_1e8);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1d8,"Property type mismatch. ",0x18);
              poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_1d8,local_2d8._M_dataplus._M_p,
                                   local_2d8._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," expects type `",0xf);
              paVar3 = (anon_struct_8_0_00000001_for___align *)(local_370 + 0x10);
              local_370._8_8_ = (anon_struct_8_0_00000001_for___align)0x5;
              local_370._16_6_ = 0x6e656b6f74;
              local_370._0_8_ = paVar3;
              poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar13,(char *)paVar3,5);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        (poVar13,"` but defined as type `",0x17);
              poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar13,local_320._M_dataplus._M_p,local_320._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"`",1);
              if ((anon_struct_8_0_00000001_for___align *)local_370._0_8_ != paVar3) {
                operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
              }
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::operator=((string *)&local_340,(string *)local_370);
              if ((anon_struct_8_0_00000001_for___align *)local_370._0_8_ != paVar3) {
                operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
              }
              ::std::__cxx11::stringstream::~stringstream((stringstream *)local_1e8);
              ::std::ios_base::~ios_base(local_168);
              goto LAB_00233fe8;
            }
            p_Var5 = p_Var18[6]._M_parent;
            p_Var6 = p_Var18[6]._M_left;
            if (p_Var6 != p_Var5) {
              std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_248,
                         (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                         &p_Var18[6]._M_parent);
            }
            iVar10 = *(int *)((long)&p_Var18[0x17]._M_parent + 4);
            pbVar12 = local_240;
            if (iVar10 == 0) {
LAB_00233f75:
              *pbVar12 = true;
              sVar19 = (string)0x1;
LAB_00233f7b:
              if ((p_Var6 == p_Var5 & ((byte)sVar19 ^ 1)) == 0) {
                AttrMetas::operator=(local_250,(AttrMetas *)(p_Var18 + 7));
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_2b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_2d8);
                local_348 = (undefined1  [8])((ulong)local_348 & 0xffffffff00000000);
                err = (string *)local_300;
              }
              else {
                local_348._0_4_ = 8;
                args_1 = (Property *)0x18;
                ::std::__cxx11::string::_M_replace
                          ((ulong)&local_340,0,(char *)local_338._M_allocated_capacity,0x3f97e4);
                err = (string *)local_300;
              }
            }
            else {
              if (iVar10 != 1) {
LAB_00233f70:
                sVar19 = (string)0x0;
                goto LAB_00233f7b;
              }
              if (p_Var18[3]._M_color == _S_black) {
                if (p_Var18[5]._M_left == p_Var18[5]._M_parent) {
                  if (p_Var18[4]._M_right == (_Base_ptr)0x0) {
                    bVar9 = false;
                  }
                  else {
                    iVar10 = (**(code **)p_Var18[4]._M_right)();
                    bVar9 = iVar10 == 4;
                  }
                  pbVar12 = local_2e0;
                  if ((bVar9) || ((p_Var18[5]._M_color & _S_black) != _S_red)) goto LAB_00233f75;
                  if (((char)p_Var18[5]._M_color == _S_red) &&
                     (((p_Var18[4]._M_right != (_Base_ptr)0x0 &&
                       (iVar10 = (**(code **)p_Var18[4]._M_right)(), iVar10 == 0)) ||
                      ((p_Var18[4]._M_right != (_Base_ptr)0x0 &&
                       (iVar10 = (**(code **)p_Var18[4]._M_right)(), iVar10 == 1))))))
                  goto LAB_00233f70;
                  Attribute::get_value<tinyusdz::Token>
                            ((optional<tinyusdz::Token> *)local_370,local_2f0);
                  sVar19 = local_370[0];
                  local_1e8[0] = (char)local_370[0];
                  if (local_370[0] == (string)0x1) {
                    local_1e8._8_8_ = apcStack_1d0;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_370._8_8_ == &aStack_358) {
                      apcStack_1d0[1] = (code *)aStack_358._8_8_;
                    }
                    else {
                      local_1e8._8_8_ = local_370._8_8_;
                    }
                    apcStack_1d0[0] = (code *)aStack_358._0_8_;
                    local_1d8 = (code *)local_370._16_8_;
                    local_370._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
                    aStack_358._0_8_ = aStack_358._0_8_ & 0xffffffffffffff00;
                    local_370._8_8_ = &aStack_358;
                  }
                  if (local_370[0] == (string)0x1) {
                    nonstd::optional_lite::optional<tinyusdz::Token>::operator=
                              (local_260,(Token *)(local_1e8 + 8));
                  }
                  else {
                    local_348._0_4_ = 4;
                    ::std::__cxx11::string::operator=
                              ((string *)&local_340,"Internal data corrupsed.");
                  }
                  if ((local_1e8[0] == '\x01') && ((code **)local_1e8._8_8_ != apcStack_1d0)) {
                    operator_delete((void *)local_1e8._8_8_,(ulong)((long)apcStack_1d0[0] + 1));
                  }
                  if (sVar19 == (string)0x0) {
                    err = (string *)local_300;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_320._M_dataplus._M_p != &local_320.field_2) {
                      operator_delete(local_320._M_dataplus._M_p,
                                      local_320.field_2._M_allocated_capacity + 1);
                      err = (string *)local_300;
                    }
                    goto LAB_00234004;
                  }
                  goto LAB_00233f7b;
                }
                local_348._0_4_ = 4;
                args_1 = (Property *)0x58;
                ::std::__cxx11::string::_M_replace
                          ((ulong)&local_340,0,(char *)local_338._M_allocated_capacity,0x3f97fd);
              }
              else {
                local_348._0_4_ = 4;
                local_2b8 = (anon_struct_8_0_00000001_for___align)0x2d;
                local_370._0_8_ = (anon_struct_8_0_00000001_for___align *)(local_370 + 0x10);
                local_370._0_8_ =
                     ::std::__cxx11::string::_M_create((ulong *)local_370,(ulong)&local_2b8);
                local_370._16_8_ = local_2b8;
                *(undefined8 *)local_370._0_8_ = 0x7475626972747441;
                *(undefined8 *)(local_370._0_8_ + 8) = 0x6d20607d7b602065;
                *(undefined8 *)(local_370._0_8_ + 0x10) = 0x6020656220747375;
                *(undefined8 *)(local_370._0_8_ + 0x18) = 0x606d726f66696e75;
                *(undefined8 *)
                 &((anon_struct_8_0_00000001_for___align *)(local_370._0_8_ + 0x18))->field_0x5 =
                     0x6972617620606d72;
                *(undefined8 *)
                 &((anon_struct_8_0_00000001_for___align *)(local_370._0_8_ + 0x20))->field_0x5 =
                     0x2e7974696c696261;
                local_370._8_8_ = local_2b8;
                (&((anon_struct_8_0_00000001_for___align *)local_370._0_8_)->field_0x0)
                [(long)local_2b8] = '\0';
                fmt::format<std::__cxx11::string>
                          ((string *)local_1e8,(fmt *)local_370,&local_2d8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2b8);
                ::std::__cxx11::string::operator=((string *)&local_340,(string *)local_1e8);
                if ((code **)local_1e8._0_8_ != &local_1d8) {
                  operator_delete((void *)local_1e8._0_8_,(long)local_1d8 + 1);
                }
                if ((anon_struct_8_0_00000001_for___align *)local_370._0_8_ !=
                    (anon_struct_8_0_00000001_for___align *)(local_370 + 0x10)) {
                  operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
                }
              }
            }
LAB_00233fe8:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_320._M_dataplus._M_p != &local_320.field_2) {
              operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1
                             );
            }
          }
LAB_00234004:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
            operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
          }
          if (local_228 != local_218) {
            operator_delete(local_228,local_218[0] + 1);
          }
          iVar10 = 0;
          if (((ulong)local_348 & 0xfffffffd) == 0) {
            iVar10 = 3;
LAB_0023426e:
            bVar9 = false;
          }
          else {
            bVar9 = true;
            if (local_348._0_4_ != 1) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1e8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
              poVar13 = (ostream *)::std::ostream::operator<<((Property *)local_1e8,0xf34);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
              local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_320,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[11],std::__cxx11::string>
                        ((string *)local_370,(fmt *)&local_320,(string *)"familyName",
                         (char (*) [11])&local_340,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1
                        );
              poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1e8,(char *)local_370._0_8_,local_370._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
              paVar3 = (anon_struct_8_0_00000001_for___align *)(local_370 + 0x10);
              if ((anon_struct_8_0_00000001_for___align *)local_370._0_8_ != paVar3) {
                operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_320._M_dataplus._M_p != &local_320.field_2) {
                operator_delete(local_320._M_dataplus._M_p,
                                local_320.field_2._M_allocated_capacity + 1);
              }
              if ((TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
                  err != (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                          *)0x0) {
                ::std::__cxx11::stringbuf::str();
                puVar14 = (undefined8 *)
                          ::std::__cxx11::string::_M_append
                                    ((char *)&local_320,
                                     (ulong)(((TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                                               *)err)->_metas).interpolation);
                paVar1 = (anon_struct_8_0_00000001_for___align *)(puVar14 + 2);
                if ((anon_struct_8_0_00000001_for___align *)*puVar14 == paVar1) {
                  local_370._16_8_ = *paVar1;
                  aStack_358._M_allocated_capacity = puVar14[3];
                  local_370._0_8_ = paVar3;
                }
                else {
                  local_370._16_8_ = *paVar1;
                  local_370._0_8_ = (anon_struct_8_0_00000001_for___align *)*puVar14;
                }
                local_370._8_8_ = *(anon_struct_8_0_00000001_for___align *)(puVar14 + 1);
                *puVar14 = paVar1;
                puVar14[1] = 0;
                *(undefined1 *)(puVar14 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)err,(string *)local_370);
                if ((anon_struct_8_0_00000001_for___align *)local_370._0_8_ != paVar3) {
                  operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_320._M_dataplus._M_p != &local_320.field_2) {
                  operator_delete(local_320._M_dataplus._M_p,
                                  local_320.field_2._M_allocated_capacity + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
              ::std::ios_base::~ios_base(local_178);
              iVar10 = 1;
              goto LAB_0023426e;
            }
          }
          if (local_340 != local_338._M_local_buf + 8) {
            operator_delete(local_340,local_338._8_8_ + 1);
          }
          if (bVar9) {
            local_208[0] = local_1f8;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_208,*(long *)(p_Var18 + 1),
                       (long)&(p_Var18[1]._M_parent)->_M_color + *(long *)(p_Var18 + 1));
            local_1e8._0_8_ = &local_1d8;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"indices","");
            args_1 = (Property *)local_1e8;
            (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                      ((ParseResult *)local_370,(_anonymous_namespace_ *)&local_2b0,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_208,&local_2f0->_name,(Property *)local_1e8,local_238,
                       in_stack_fffffffffffffc88);
            if ((code **)local_1e8._0_8_ != &local_1d8) {
              operator_delete((void *)local_1e8._0_8_,(long)local_1d8 + 1);
            }
            if (local_208[0] != local_1f8) {
              operator_delete(local_208[0],local_1f8[0] + 1);
            }
            iVar10 = 0;
            if ((local_370._0_8_ & 0xfffffffd) == 0) {
              iVar10 = 3;
LAB_0023456f:
              bVar9 = false;
            }
            else {
              bVar9 = true;
              if (local_370._0_4_ != Unmatched) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e8,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1e8,"ReconstructPrim",0xf);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3);
                poVar13 = (ostream *)::std::ostream::operator<<((Property *)local_1e8,0xf35);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
                local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_320,"Parsing attribute `{}` failed. Error: {}","");
                fmt::format<char[8],std::__cxx11::string>
                          ((string *)local_348,(fmt *)&local_320,(string *)"indices",
                           (char (*) [8])(local_370 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           args_1);
                poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1e8,(char *)local_348,(long)local_340);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
                if (local_348 != (undefined1  [8])&local_338) {
                  operator_delete((void *)local_348,(ulong)(local_338._M_allocated_capacity + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_320._M_dataplus._M_p != &local_320.field_2) {
                  operator_delete(local_320._M_dataplus._M_p,
                                  local_320.field_2._M_allocated_capacity + 1);
                }
                if ((TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                     *)err != (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                               *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar15 = (long *)::std::__cxx11::string::_M_append
                                              ((char *)&local_320,
                                               (ulong)(((
                                                  TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                                                  *)err)->_metas).interpolation);
                  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)(plVar15 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar15 == paVar2) {
                    local_338._M_allocated_capacity = paVar2->_M_allocated_capacity;
                    local_338._8_8_ = plVar15[3];
                    local_348 = (undefined1  [8])&local_338;
                  }
                  else {
                    local_338._M_allocated_capacity = paVar2->_M_allocated_capacity;
                    local_348 = (undefined1  [8])*plVar15;
                  }
                  local_340 = (char *)plVar15[1];
                  *plVar15 = (long)paVar2;
                  plVar15[1] = 0;
                  *(undefined1 *)(plVar15 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)err,(string *)local_348);
                  if (local_348 != (undefined1  [8])&local_338) {
                    operator_delete((void *)local_348,(ulong)(local_338._M_allocated_capacity + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_320._M_dataplus._M_p != &local_320.field_2) {
                    operator_delete(local_320._M_dataplus._M_p,
                                    local_320.field_2._M_allocated_capacity + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
                ::std::ios_base::~ios_base(local_178);
                iVar10 = 1;
                goto LAB_0023456f;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_370._8_8_ != &aStack_358) {
              operator_delete((void *)local_370._8_8_,(ulong)(aStack_358._0_8_ + 1));
            }
            if (bVar9) {
              p_Var5 = p_Var18 + 1;
              iVar10 = ::std::__cxx11::string::compare((char *)p_Var5);
              if (iVar10 == 0) {
                local_1e8._0_8_ = &local_1d8;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1e8,"elementType","");
                cVar16 = ::std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::find(&local_2b0,(key_type *)local_1e8);
                if ((code **)local_1e8._0_8_ != &local_1d8) {
                  operator_delete((void *)local_1e8._0_8_,(long)local_1d8 + 1);
                }
                err = (string *)local_300;
                iVar10 = 3;
                if ((_Rb_tree_header *)cVar16._M_node == &local_2b0._M_impl.super__Rb_tree_header) {
                  if (((ulong)p_Var18[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
                    local_1e8._0_8_ = &local_1d8;
                    local_1e8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
                    local_1d8 = (code *)((ulong)local_1d8 & 0xffffffffffffff00);
                  }
                  else {
                    Attribute::type_name_abi_cxx11_((string *)local_1e8,local_2f0);
                  }
                  local_370._0_8_ = local_370 + 0x10;
                  local_370._8_8_ = (anon_struct_8_0_00000001_for___align)0x5;
                  local_370._16_6_ = 0x6e656b6f74;
                  if ((((anon_struct_8_0_00000001_for___align)local_1e8._8_8_ ==
                        (anon_struct_8_0_00000001_for___align)0x5) &&
                      (iVar11 = bcmp((void *)local_1e8._0_8_,local_370 + 0x10,5), iVar11 == 0)) &&
                     (uVar4 = *(uint *)((long)&p_Var18[0x17]._M_parent + 4), uVar4 < 2)) {
                    if ((code **)local_1e8._0_8_ != &local_1d8) {
                      operator_delete((void *)local_1e8._0_8_,(long)local_1d8 + 1);
                    }
                    if (uVar4 == 0) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,"[warn]",6);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                 ,0x5a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,"ReconstructPrim",0xf);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,"():",3);
                      poVar13 = (ostream *)::std::ostream::operator<<((Property *)local_1e8,0xf36);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,"No value assigned to `",0x16);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,"elementType",0xb);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,"` token attribute. Set default token value.",
                                 0x2b);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1e8,"\n",1);
                      if (local_2f8 != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_370,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_348,err);
                        ::std::__cxx11::string::operator=((string *)local_2f8,(string *)local_370);
                        if ((anon_struct_8_0_00000001_for___align *)local_370._0_8_ !=
                            (anon_struct_8_0_00000001_for___align *)(local_370 + 0x10)) {
                          operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
                        }
                        if (local_348 != (undefined1  [8])&local_338) {
                          operator_delete((void *)local_348,
                                          (ulong)(local_338._M_allocated_capacity + 1));
                        }
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
                      ::std::ios_base::~ios_base(local_178);
                      AttrMetas::operator=((AttrMetas *)local_2e8,(AttrMetas *)(p_Var18 + 7));
                      local_1e8._0_8_ = &local_1d8;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_1e8,"elementType","");
                      ::std::
                      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      ::_M_insert_unique<std::__cxx11::string>
                                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                  *)&local_2b0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1e8);
                      if ((code **)local_1e8._0_8_ != &local_1d8) {
                        operator_delete((void *)local_1e8._0_8_,(long)local_1d8 + 1);
                      }
                      goto LAB_00234dd4;
                    }
                  }
                  else if ((code **)local_1e8._0_8_ != &local_1d8) {
                    operator_delete((void *)local_1e8._0_8_,(long)local_1d8 + 1);
                  }
                  local_370._0_8_ = local_370 + 0x10;
                  local_1e8._0_8_ = (pointer)0x0;
                  local_1e8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
                  apcStack_1d0[0] =
                       ::std::
                       _Function_handler<nonstd::expected_lite::expected<tinyusdz::GeomSubset::ElementType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:3869:29)>
                       ::_M_invoke;
                  local_1d8 = ::std::
                              _Function_handler<nonstd::expected_lite::expected<tinyusdz::GeomSubset::ElementType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:3869:29)>
                              ::_M_manager;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_370,"elementType","");
                  bVar9 = options->strict_allowedToken_check;
                  local_58._16_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
                  local_58._24_8_ = (code *)0x0;
                  local_58.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                  local_58._8_8_ = 0;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1d8 !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
                    (*local_1d8)(&local_58,(Property *)local_1e8,2);
                    local_58._16_8_ = local_1d8;
                    local_58._24_8_ = apcStack_1d0[0];
                  }
                  args_1 = local_2e8;
                  in_stack_fffffffffffffc88 =
                       (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                        *)err;
                  bVar9 = ParseUniformEnumProperty<tinyusdz::GeomSubset::ElementType,tinyusdz::GeomSubset::ElementType>
                                    ((string *)local_370,bVar9,
                                     (EnumHandlerFun<tinyusdz::GeomSubset::ElementType> *)&local_58,
                                     local_2f0,
                                     (TypedAttributeWithFallback<tinyusdz::GeomSubset::ElementType>
                                      *)local_2e8,local_2f8,err);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_58._16_8_ !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
                    (*(code *)local_58._16_8_)(&local_58,&local_58,3);
                  }
                  if ((anon_struct_8_0_00000001_for___align *)local_370._0_8_ !=
                      (anon_struct_8_0_00000001_for___align *)(local_370 + 0x10)) {
                    operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
                  }
                  iVar10 = 1;
                  if (bVar9) {
                    AttrMetas::operator=((AttrMetas *)local_2e8,(AttrMetas *)(p_Var18 + 7));
                    local_370._0_8_ = (anon_struct_8_0_00000001_for___align *)(local_370 + 0x10);
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_370,"elementType","");
                    ::std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)&local_2b0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_370);
                    if ((anon_struct_8_0_00000001_for___align *)local_370._0_8_ !=
                        (anon_struct_8_0_00000001_for___align *)(local_370 + 0x10)) {
                      operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
                    }
                    iVar10 = 3;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1d8 !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0) {
                    (*local_1d8)((Property *)local_1e8,(Property *)local_1e8,3);
                  }
                }
              }
              else {
                cVar16 = ::std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::find(&local_2b0,(key_type *)p_Var5);
                if ((_Rb_tree_header *)cVar16._M_node == &local_2b0._M_impl.super__Rb_tree_header) {
                  pmVar17 = ::std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                            ::operator[](local_258,(key_type *)p_Var5);
                  ::std::__cxx11::string::_M_assign((string *)pmVar17);
                  (pmVar17->_attrib)._varying_authored = (bool)p_Var18[3].field_0x4;
                  (pmVar17->_attrib)._variability = p_Var18[3]._M_color;
                  ::std::__cxx11::string::_M_assign((string *)&(pmVar17->_attrib)._type_name);
                  linb::any::operator=((any *)&(pmVar17->_attrib)._var,(any *)&p_Var18[4]._M_parent)
                  ;
                  (pmVar17->_attrib)._var._blocked = SUB41(p_Var18[5]._M_color,0);
                  ::std::
                  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                  ::operator=(&(pmVar17->_attrib)._var._ts._samples,
                              (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                               *)&p_Var18[5]._M_parent);
                  (pmVar17->_attrib)._var._ts._dirty = SUB41(p_Var18[6]._M_color,0);
                  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                             &(pmVar17->_attrib)._paths,
                             (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                             &p_Var18[6]._M_parent);
                  AttrMetas::operator=(&(pmVar17->_attrib)._metas,(AttrMetas *)(p_Var18 + 7));
                  *(_Base_ptr *)&pmVar17->_listOpQual = p_Var18[0x17]._M_parent;
                  (pmVar17->_rel).type = *(Type *)&p_Var18[0x17]._M_left;
                  Path::operator=(&(pmVar17->_rel).targetPath,(Path *)&p_Var18[0x17]._M_right);
                  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                             &(pmVar17->_rel).targetPathVector,
                             (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                             &p_Var18[0x1e]._M_parent);
                  (pmVar17->_rel).listOpQual = p_Var18[0x1f]._M_color;
                  AttrMetas::operator=
                            (&(pmVar17->_rel)._metas,(AttrMetas *)&p_Var18[0x1f]._M_parent);
                  (pmVar17->_rel)._varying_authored = *(bool *)&p_Var18[0x2f]._M_left;
                  ::std::__cxx11::string::_M_assign((string *)&pmVar17->_prop_value_type_name);
                  pmVar17->_has_custom = *(bool *)&p_Var18[0x30]._M_right;
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&local_2b0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             p_Var5);
                }
                cVar16 = ::std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::find(&local_2b0,(key_type *)p_Var5);
                iVar10 = 0;
                err = (string *)local_300;
                if ((_Rb_tree_header *)cVar16._M_node == &local_2b0._M_impl.super__Rb_tree_header) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1e8,"[warn]",6);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1e8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1e8,"ReconstructPrim",0xf);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e8,"():",3)
                  ;
                  poVar13 = (ostream *)::std::ostream::operator<<((Property *)local_1e8,0xf38);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_370,"Unsupported/unimplemented property: ",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)p_Var5);
                  poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_1e8,(char *)local_370._0_8_,local_370._8_8_)
                  ;
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
                  if ((anon_struct_8_0_00000001_for___align *)local_370._0_8_ !=
                      (anon_struct_8_0_00000001_for___align *)(local_370 + 0x10)) {
                    operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
                  }
                  err = (string *)local_300;
                  if (local_2f8 != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    puVar14 = (undefined8 *)
                              ::std::__cxx11::string::_M_append
                                        (local_348,
                                         (ulong)(((
                                                  TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
                                                  *)err)->_metas).interpolation);
                    paVar3 = (anon_struct_8_0_00000001_for___align *)(puVar14 + 2);
                    if ((anon_struct_8_0_00000001_for___align *)*puVar14 == paVar3) {
                      local_370._16_8_ = *paVar3;
                      aStack_358._M_allocated_capacity = puVar14[3];
                      local_370._0_8_ = (anon_struct_8_0_00000001_for___align *)(local_370 + 0x10);
                    }
                    else {
                      local_370._16_8_ = *paVar3;
                      local_370._0_8_ = (anon_struct_8_0_00000001_for___align *)*puVar14;
                    }
                    local_370._8_8_ = *(anon_struct_8_0_00000001_for___align *)(puVar14 + 1);
                    *puVar14 = paVar3;
                    puVar14[1] = 0;
                    *(undefined1 *)(puVar14 + 2) = 0;
                    ::std::__cxx11::string::operator=((string *)local_2f8,(string *)local_370);
                    if ((anon_struct_8_0_00000001_for___align *)local_370._0_8_ !=
                        (anon_struct_8_0_00000001_for___align *)(local_370 + 0x10)) {
                      operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
                    }
                    if (local_348 != (undefined1  [8])&local_338) {
                      operator_delete((void *)local_348,(ulong)(local_338._M_allocated_capacity + 1)
                                     );
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
                  ::std::ios_base::~ios_base(local_178);
                }
              }
            }
          }
LAB_00234dd4:
          if ((iVar10 != 3) && (iVar10 != 0)) break;
          p_Var18 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var18);
          bVar21 = p_Var18 == local_230;
        } while (!bVar21);
      }
    }
    else {
      bVar21 = false;
    }
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_2b0,(_Link_type)local_2b0._M_impl.super__Rb_tree_header._M_header._M_parent);
  return bVar21;
}

Assistant:

bool ReconstructPrim<GeomSubset>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    GeomSubset *subset,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)spec;
  (void)references;

  DCOUT("GeomSubset");

  // Currently schema only allows 'face'
  auto ElementTypeHandler = [](const std::string &tok)
      -> nonstd::expected<GeomSubset::ElementType, std::string> {
    using EnumTy = std::pair<GeomSubset::ElementType, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(GeomSubset::ElementType::Face, "face"),
        std::make_pair(GeomSubset::ElementType::Point, "point"),
    };
    return EnumHandler<GeomSubset::ElementType>("elementType", tok,
                                                    enums);
  };

  std::set<std::string> table;

  if (!prim::ReconstructMaterialBindingProperties(table, properties, subset, err)) {
    return false;
  }

  if (!prim::ReconstructCollectionProperties(
    table, properties, subset, warn, err, options.strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "familyName", GeomSubset, subset->familyName)
    PARSE_TYPED_ATTRIBUTE(table, prop, "indices", GeomSubset, subset->indices)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, "elementType", GeomSubset::ElementType, ElementTypeHandler, GeomSubset, subset->elementType, options.strict_allowedToken_check)
    ADD_PROPERTY(table, prop, GeomSubset, subset->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}